

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtUtil.c
# Opt level: O3

Rwt_Node_t * Rwt_ManAddVar(Rwt_Man_t *p,uint uTruth,int fPrecompute)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Rwt_Node_t *pRVar4;
  Rwt_Node_t **ppRVar5;
  Rwt_Node_t *pRVar6;
  void **ppvVar7;
  Rwt_Node_t **ppRVar8;
  
  pRVar6 = (Rwt_Node_t *)Mem_FixedEntryFetch(p->pMmNode);
  pRVar6->Id = p->vForest->nSize;
  pRVar6->TravId = 0;
  *(uint *)&pRVar6->field_0x8 = uTruth & 0xffff | 0x40000000;
  pRVar6->p0 = (Rwt_Node_t *)0x0;
  pRVar6->p1 = (Rwt_Node_t *)0x0;
  pRVar6->pNext = (Rwt_Node_t *)0x0;
  pVVar3 = p->vForest;
  uVar1 = pVVar3->nSize;
  if (uVar1 == pVVar3->nCap) {
    if ((int)uVar1 < 0x10) {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc(0x80);
      }
      else {
        ppvVar7 = (void **)realloc(pVVar3->pArray,0x80);
      }
      pVVar3->pArray = ppvVar7;
      pVVar3->nCap = 0x10;
    }
    else {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar7 = (void **)realloc(pVVar3->pArray,(ulong)uVar1 << 4);
      }
      pVVar3->pArray = ppvVar7;
      pVVar3->nCap = uVar1 * 2;
    }
  }
  else {
    ppvVar7 = pVVar3->pArray;
  }
  iVar2 = pVVar3->nSize;
  pVVar3->nSize = iVar2 + 1;
  ppvVar7[iVar2] = pRVar6;
  if (fPrecompute != 0) {
    ppRVar5 = p->pTable + uTruth;
    do {
      ppRVar8 = ppRVar5;
      pRVar4 = *ppRVar8;
      ppRVar5 = &pRVar4->pNext;
    } while (pRVar4 != (Rwt_Node_t *)0x0);
    *ppRVar8 = pRVar6;
  }
  return pRVar6;
}

Assistant:

Rwt_Node_t * Rwt_ManAddVar( Rwt_Man_t * p, unsigned uTruth, int fPrecompute )
{
    Rwt_Node_t * pNew;
    pNew = (Rwt_Node_t *)Mem_FixedEntryFetch( p->pMmNode );
    pNew->Id     = p->vForest->nSize;
    pNew->TravId = 0;
    pNew->uTruth = uTruth;
    pNew->Level  = 0;
    pNew->Volume = 0;
    pNew->fUsed  = 1;
    pNew->fExor  = 0;
    pNew->p0     = NULL;
    pNew->p1     = NULL;
    pNew->pNext  = NULL;
    Vec_PtrPush( p->vForest, pNew );
    if ( fPrecompute )
        Rwt_ListAddToTail( p->pTable + uTruth, pNew );
    return pNew;
}